

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iStack.h
# Opt level: O1

iStack<Imaginer::Utils::iRpn::RPNnode> __thiscall
Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>::cut
          (iStack<Imaginer::Utils::iRpn::RPNnode> *this,int start,int end)

{
  long lVar1;
  int in_ECX;
  int iVar2;
  long lVar3;
  long extraout_RDX;
  long lVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  long lVar6;
  RPNnode *pRVar7;
  iStack<Imaginer::Utils::iRpn::RPNnode> iVar8;
  int local_24;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,start);
  iStack(this,&local_24);
  iVar2 = *(int *)((long)plVar5 + 0xc) + 1;
  if (in_ECX <= *(int *)((long)plVar5 + 0xc)) {
    iVar2 = in_ECX;
  }
  lVar4 = extraout_RDX;
  if (end < iVar2) {
    lVar3 = (long)end << 4;
    lVar4 = 0;
    do {
      lVar1 = *plVar5;
      lVar6 = (long)this->_top + 1;
      this->_top = (int)lVar6;
      pRVar7 = this->_data + lVar6;
      if ((RPNnode *)(lVar1 + lVar3) != pRVar7) {
        pRVar7->_node = *(anon_union_8_2_93b31755_for__node *)(lVar1 + lVar3);
        pRVar7->_is = *(bool *)(lVar1 + 8 + lVar3);
      }
      lVar3 = lVar3 + 0x10;
      lVar4 = lVar4 + -1;
    } while ((long)end - (long)iVar2 != lVar4);
    end = end - (int)lVar4;
  }
  *plVar5 = *plVar5 + (long)end * 0x10;
  *(int *)((long)plVar5 + 0xc) = *(int *)((long)plVar5 + 0xc) - end;
  iVar8._size = (int)lVar4;
  iVar8._top = (int)((ulong)lVar4 >> 0x20);
  iVar8._data = (RPNnode *)this;
  return iVar8;
}

Assistant:

iStack<Type>  cut(int start = 0,int end = 1024)
    {
        iStack<Type> rt;
        (end > size())?(end = size()+1):(end);
        int i = start;
        while(i < end)
        {
            rt.push(_data[i++]);
        }
        _data = _data+i;
        _top-=i;
        return rt;
    }